

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

void __thiscall
capnp::DynamicList::Builder::Builder(Builder *this,ListSchema schema,OrphanBuilder *orphan)

{
  ElementSize elementSize;
  Which elementType;
  uint uVar1;
  ushort uVar2;
  Type local_60;
  Schema local_50;
  Reader local_48;
  
  local_60.field_4 = schema.elementType.field_4;
  local_60._0_8_ = schema.elementType._0_8_;
  (this->schema).elementType.baseType = local_60.baseType;
  (this->schema).elementType.listDepth = local_60.listDepth;
  (this->schema).elementType.isImplicitParam = local_60.isImplicitParam;
  (this->schema).elementType.field_3 = local_60.field_3;
  *(short *)&(this->schema).elementType.field_0x6 = local_60._6_2_;
  (this->schema).elementType.field_4.scopeId = (uint64_t)local_60.field_4;
  elementType = LIST;
  if (((undefined1  [16])schema.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0)
  {
    elementType = schema.elementType.baseType;
  }
  if (elementType == STRUCT) {
    local_50.raw = (RawBrandedSchema *)Type::asStruct(&local_60);
    Schema::getProto(&local_48,&local_50);
    uVar1 = 0;
    if (local_48._reader.dataSize < 0x80) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)((long)local_48._reader.data + 0xe);
      if (0xcf < local_48._reader.dataSize) {
        uVar1 = (uint)*(ushort *)((long)local_48._reader.data + 0x18) << 0x10;
      }
    }
    capnp::_::OrphanBuilder::asStructList(&this->builder,orphan,(StructSize)(uVar2 | uVar1));
  }
  else {
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    capnp::_::OrphanBuilder::asList(&this->builder,orphan,elementSize);
  }
  return;
}

Assistant:

DynamicList::Builder::Builder(ListSchema schema, _::OrphanBuilder& orphan)
    : schema(schema), builder(schema.whichElementType() == schema::Type::STRUCT
        ? orphan.asStructList(structSizeFromSchema(schema.getStructElementType()))
        : orphan.asList(elementSizeFor(schema.whichElementType()))) {}